

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonlinear_beamformer.cc
# Opt level: O2

void __thiscall webrtc::NonlinearBeamformer::InitTargetCovMats(NonlinearBeamformer *this)

{
  Matrix<std::complex<float>_> *this_00;
  complex<float> *pcVar1;
  pointer ppcVar2;
  ComplexMatrixF *pCVar3;
  string *result;
  int line;
  size_t i;
  ulong uVar4;
  size_t j;
  ulong uVar5;
  long lVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  size_t local_1d0;
  ComplexMatrixF *local_1c8;
  ComplexMatrixF *local_1c0;
  NonlinearBeamformer *local_1b8;
  long local_1b0;
  FatalMessage local_1a8;
  
  local_1c0 = this->target_cov_mats_;
  local_1c8 = this->delay_sum_masks_;
  lVar6 = 0;
  local_1b8 = this;
  while( true ) {
    pCVar3 = local_1c8;
    if (lVar6 == 0x81) {
      return;
    }
    this_00 = &local_1c0[lVar6].super_Matrix<std::complex<float>_>;
    Matrix<std::complex<float>_>::Resize
              (this_00,local_1b8->num_input_channels_,local_1b8->num_input_channels_);
    local_1d0 = CONCAT44(local_1d0._4_4_,1);
    local_1a8._0_8_ = pCVar3[lVar6].super_Matrix<std::complex<float>_>.num_rows_;
    result = rtc::CheckEQImpl<unsigned_int,unsigned_long>
                       ((uint *)&local_1d0,(unsigned_long *)&local_1a8,"1u == in.num_rows()");
    if (result != (string *)0x0) break;
    local_1a8._0_8_ = this_00->num_rows_;
    local_1d0 = pCVar3[lVar6].super_Matrix<std::complex<float>_>.num_columns_;
    result = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                       ((unsigned_long *)&local_1a8,&local_1d0,"out->num_rows() == in.num_columns()"
                       );
    if (result != (string *)0x0) {
      line = 0x9a;
      goto LAB_0017a3c6;
    }
    local_1a8._0_8_ = this_00->num_columns_;
    local_1d0 = pCVar3[lVar6].super_Matrix<std::complex<float>_>.num_columns_;
    local_1b0 = lVar6;
    result = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                       ((unsigned_long *)&local_1a8,&local_1d0,
                        "out->num_columns() == in.num_columns()");
    if (result != (string *)0x0) {
      line = 0x9b;
      goto LAB_0017a3c6;
    }
    pcVar1 = *pCVar3[lVar6].super_Matrix<std::complex<float>_>.elements_.
              super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppcVar2 = (this_00->elements_).
              super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    for (uVar4 = 0; uVar4 < this_00->num_rows_; uVar4 = uVar4 + 1) {
      for (uVar5 = 0; uVar5 < this_00->num_columns_; uVar5 = uVar5 + 1) {
        local_1a8._0_8_ =
             CONCAT44(*(undefined4 *)((long)&pcVar1[uVar5]._M_value + 4),(int)pcVar1[uVar5]._M_value
                     ) ^ 0x8000000000000000;
        std::operator*(pcVar1 + uVar4,(complex<float> *)&local_1a8);
        ppcVar2[uVar4][uVar5]._M_value = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      }
    }
    lVar6 = local_1b0 + 1;
  }
  line = 0x99;
LAB_0017a3c6:
  rtc::FatalMessage::FatalMessage
            (&local_1a8,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/nonlinear_beamformer.cc"
             ,line,result);
  rtc::FatalMessage::~FatalMessage(&local_1a8);
}

Assistant:

void NonlinearBeamformer::InitTargetCovMats() {
  for (size_t i = 0; i < kNumFreqBins; ++i) {
    target_cov_mats_[i].Resize(num_input_channels_, num_input_channels_);
    TransposedConjugatedProduct(delay_sum_masks_[i], &target_cov_mats_[i]);
  }
}